

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O1

int pkey_rsa_ctrl(EVP_PKEY_CTX *ctx,int type,int p1,void *p2)

{
  int *piVar1;
  byte bVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  EVP_MD *pEVar6;
  int line;
  
  piVar1 = (int *)ctx->data;
  switch(type) {
  case 0x1001:
    if (((uint)p1 < 7) && ((0x5aU >> (p1 & 0x1fU) & 1) != 0)) {
      if ((p1 == 3) && (*(long *)(piVar1 + 6) != 0)) {
        ERR_put_error(6,0,0x73,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                      ,0x151);
      }
      else {
        if (p1 == 4) {
          bVar2 = (byte)ctx->operation & 0xc0;
        }
        else {
          if (p1 != 6) goto LAB_0016e881;
          bVar2 = (byte)ctx->operation & 0x18;
        }
        if (bVar2 != 0) {
          if (*(long *)(piVar1 + 6) == 0) {
            pEVar6 = EVP_sha1();
            *(EVP_MD **)(piVar1 + 6) = pEVar6;
          }
LAB_0016e881:
          piVar1[4] = p1;
          return 1;
        }
      }
    }
    iVar4 = 0x6d;
    line = 0x16d;
LAB_0016e838:
    ERR_put_error(6,0,iVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                  ,line);
    return 0;
  case 0x1002:
    iVar4 = piVar1[4];
    goto LAB_0016e72b;
  case 0x1003:
  case 0x1004:
    if (piVar1[4] != 6) {
      iVar4 = 0x74;
      line = 0x17e;
      goto LAB_0016e838;
    }
    if (type != 0x1004) {
      if (-3 < p1) {
        piVar1[10] = p1;
        return 1;
      }
      return 0;
    }
    iVar4 = piVar1[10];
LAB_0016e72b:
    *(int *)p2 = iVar4;
    break;
  case 0x1005:
    if (p1 < 0x100) {
      iVar4 = 0x70;
      line = 0x18d;
      goto LAB_0016e838;
    }
    *piVar1 = p1;
    break;
  case 0x1006:
    if (p2 == (void *)0x0) {
      return 0;
    }
    BN_free(*(BIGNUM **)(piVar1 + 2));
    *(void **)(piVar1 + 2) = p2;
    break;
  case 0x1007:
  case 0x1008:
    if (piVar1[4] != 4) {
      iVar4 = 0x73;
      line = 0x19e;
      goto LAB_0016e838;
    }
    if (type != 0x1008) {
LAB_0016e77e:
      *(void **)(piVar1 + 6) = p2;
      return 1;
    }
    goto LAB_0016e65b;
  case 0x1009:
  case 0x100a:
    if ((piVar1[4] | 2U) != 6) {
      iVar4 = 0x71;
      line = 0x1b7;
      goto LAB_0016e838;
    }
    if (type != 0x100a) {
      *(void **)(piVar1 + 8) = p2;
      return 1;
    }
    lVar5 = *(long *)(piVar1 + 8);
    if (lVar5 == 0) goto LAB_0016e65b;
    goto LAB_0016e65f;
  case 0x100b:
    if (piVar1[4] != 4) {
      iVar4 = 0x73;
      line = 0x1c7;
      goto LAB_0016e838;
    }
    OPENSSL_free(*(void **)(piVar1 + 0xe));
    *(undefined8 *)(piVar1 + 0xe) = *p2;
    *(undefined8 *)(piVar1 + 0x10) = *(undefined8 *)((long)p2 + 8);
    break;
  case 0x100c:
    if (piVar1[4] != 4) {
      iVar4 = 0x73;
      line = 0x1d4;
      goto LAB_0016e838;
    }
    uVar3 = *(undefined8 *)(piVar1 + 0x10);
    *(undefined8 *)p2 = *(undefined8 *)(piVar1 + 0xe);
    *(undefined8 *)((long)p2 + 8) = uVar3;
    break;
  default:
    if (type == 1) {
      if ((p2 == (void *)0x0) || (piVar1[4] != 3)) goto LAB_0016e77e;
      iVar4 = 0x73;
      line = 0x151;
      goto LAB_0016e838;
    }
    if (type != 2) {
      iVar4 = 0x65;
      line = 0x1db;
      goto LAB_0016e838;
    }
LAB_0016e65b:
    lVar5 = *(long *)(piVar1 + 6);
LAB_0016e65f:
    *(long *)p2 = lVar5;
  }
  return 1;
}

Assistant:

static int pkey_rsa_ctrl(EVP_PKEY_CTX *ctx, int type, int p1, void *p2) {
  RSA_PKEY_CTX *rctx = reinterpret_cast<RSA_PKEY_CTX *>(ctx->data);
  switch (type) {
    case EVP_PKEY_CTRL_RSA_PADDING:
      if (!is_known_padding(p1) || !check_padding_md(rctx->md, p1) ||
          (p1 == RSA_PKCS1_PSS_PADDING &&
           0 == (ctx->operation & (EVP_PKEY_OP_SIGN | EVP_PKEY_OP_VERIFY))) ||
          (p1 == RSA_PKCS1_OAEP_PADDING &&
           0 == (ctx->operation & EVP_PKEY_OP_TYPE_CRYPT))) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_ILLEGAL_OR_UNSUPPORTED_PADDING_MODE);
        return 0;
      }
      if ((p1 == RSA_PKCS1_PSS_PADDING || p1 == RSA_PKCS1_OAEP_PADDING) &&
          rctx->md == NULL) {
        rctx->md = EVP_sha1();
      }
      rctx->pad_mode = p1;
      return 1;

    case EVP_PKEY_CTRL_GET_RSA_PADDING:
      *(int *)p2 = rctx->pad_mode;
      return 1;

    case EVP_PKEY_CTRL_RSA_PSS_SALTLEN:
    case EVP_PKEY_CTRL_GET_RSA_PSS_SALTLEN:
      if (rctx->pad_mode != RSA_PKCS1_PSS_PADDING) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PSS_SALTLEN);
        return 0;
      }
      if (type == EVP_PKEY_CTRL_GET_RSA_PSS_SALTLEN) {
        *(int *)p2 = rctx->saltlen;
      } else {
        if (p1 < -2) {
          return 0;
        }
        rctx->saltlen = p1;
      }
      return 1;

    case EVP_PKEY_CTRL_RSA_KEYGEN_BITS:
      if (p1 < 256) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_KEYBITS);
        return 0;
      }
      rctx->nbits = p1;
      return 1;

    case EVP_PKEY_CTRL_RSA_KEYGEN_PUBEXP:
      if (!p2) {
        return 0;
      }
      BN_free(rctx->pub_exp);
      rctx->pub_exp = reinterpret_cast<BIGNUM *>(p2);
      return 1;

    case EVP_PKEY_CTRL_RSA_OAEP_MD:
    case EVP_PKEY_CTRL_GET_RSA_OAEP_MD:
      if (rctx->pad_mode != RSA_PKCS1_OAEP_PADDING) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PADDING_MODE);
        return 0;
      }
      if (type == EVP_PKEY_CTRL_GET_RSA_OAEP_MD) {
        *(const EVP_MD **)p2 = rctx->md;
      } else {
        rctx->md = reinterpret_cast<EVP_MD *>(p2);
      }
      return 1;

    case EVP_PKEY_CTRL_MD:
      if (!check_padding_md(reinterpret_cast<EVP_MD *>(p2), rctx->pad_mode)) {
        return 0;
      }
      rctx->md = reinterpret_cast<EVP_MD *>(p2);
      return 1;

    case EVP_PKEY_CTRL_GET_MD:
      *(const EVP_MD **)p2 = rctx->md;
      return 1;

    case EVP_PKEY_CTRL_RSA_MGF1_MD:
    case EVP_PKEY_CTRL_GET_RSA_MGF1_MD:
      if (rctx->pad_mode != RSA_PKCS1_PSS_PADDING &&
          rctx->pad_mode != RSA_PKCS1_OAEP_PADDING) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_MGF1_MD);
        return 0;
      }
      if (type == EVP_PKEY_CTRL_GET_RSA_MGF1_MD) {
        if (rctx->mgf1md) {
          *(const EVP_MD **)p2 = rctx->mgf1md;
        } else {
          *(const EVP_MD **)p2 = rctx->md;
        }
      } else {
        rctx->mgf1md = reinterpret_cast<EVP_MD *>(p2);
      }
      return 1;

    case EVP_PKEY_CTRL_RSA_OAEP_LABEL: {
      if (rctx->pad_mode != RSA_PKCS1_OAEP_PADDING) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PADDING_MODE);
        return 0;
      }
      OPENSSL_free(rctx->oaep_label);
      RSA_OAEP_LABEL_PARAMS *params =
          reinterpret_cast<RSA_OAEP_LABEL_PARAMS *>(p2);
      rctx->oaep_label = params->data;
      rctx->oaep_labellen = params->len;
      return 1;
    }

    case EVP_PKEY_CTRL_GET_RSA_OAEP_LABEL:
      if (rctx->pad_mode != RSA_PKCS1_OAEP_PADDING) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PADDING_MODE);
        return 0;
      }
      CBS_init((CBS *)p2, rctx->oaep_label, rctx->oaep_labellen);
      return 1;

    default:
      OPENSSL_PUT_ERROR(EVP, EVP_R_COMMAND_NOT_SUPPORTED);
      return 0;
  }
}